

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_cc(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  ulong in_RSI;
  char *in_RDI;
  uint32_t a4_1;
  uint32_t a3_1;
  uint32_t a2_1;
  uint32_t a1_1;
  uint32_t a0_1;
  size_t iters;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  uint32_t f;
  uint32_t g;
  uint32_t h;
  uint32_t local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  uint local_20;
  uint local_1c;
  ulong local_18;
  char *local_10;
  uint32_t local_4;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        local_5c = farmhash32_cc_len_0_to_4
                             ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      else {
        local_5c = farmhash32_cc_len_5_to_12
                             ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
    }
    else {
      local_5c = farmhash32_cc_len_13_to_24
                           ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    local_4 = local_5c;
  }
  else {
    local_1c = (uint)in_RSI;
    local_24 = local_1c * -0x3361d2af;
    local_20 = local_24;
    local_18 = in_RSI;
    local_10 = in_RDI;
    uVar1 = fetch32(in_RDI + (in_RSI - 4));
    uVar1 = ror32(uVar1 * -0x3361d2af,0x11);
    uVar2 = fetch32(local_10 + (local_18 - 8));
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    uVar3 = uVar2 * 0x1b873593;
    uVar2 = fetch32(local_10 + (local_18 - 0x10));
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    uVar4 = uVar2 * 0x1b873593;
    uVar2 = fetch32(local_10 + (local_18 - 0xc));
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    uVar5 = uVar2 * 0x1b873593;
    uVar2 = fetch32(local_10 + (local_18 - 0x14));
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    iVar6 = uVar2 * 0x1b873593;
    local_1c = uVar1 * 0x1b873593 ^ local_1c;
    uVar1 = ror32(local_1c,0x13);
    local_1c = uVar4 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = ror32(local_1c,0x13);
    local_1c = uVar1 * 5 + 0xe6546b64;
    local_20 = uVar3 ^ local_20;
    uVar1 = ror32(local_20,0x13);
    local_20 = uVar5 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = ror32(local_20,0x13);
    local_20 = uVar1 * 5 + 0xe6546b64;
    local_24 = iVar6 + local_24;
    uVar1 = ror32(local_24,0x13);
    local_24 = uVar1 * 5 + 0xe6546b64;
    local_40 = (local_18 - 1) / 0x14;
    do {
      uVar1 = fetch32(local_10);
      uVar1 = ror32(uVar1 * -0x3361d2af,0x11);
      uVar2 = fetch32(local_10 + 4);
      uVar7 = fetch32(local_10 + 8);
      uVar7 = ror32(uVar7 * -0x3361d2af,0x11);
      iVar6 = uVar7 * 0x1b873593;
      uVar7 = fetch32(local_10 + 0xc);
      uVar7 = ror32(uVar7 * -0x3361d2af,0x11);
      iVar8 = uVar7 * 0x1b873593;
      uVar7 = fetch32(local_10 + 0x10);
      local_1c = uVar1 * 0x1b873593 ^ local_1c;
      uVar9 = ror32(local_1c,0x12);
      local_1c = uVar9 * 5 + 0xe6546b64;
      local_24 = uVar2 + local_24;
      local_24 = ror32(local_24,0x13);
      local_24 = local_24 * -0x3361d2af;
      local_20 = iVar6 + local_20;
      uVar9 = ror32(local_20,0x12);
      local_20 = uVar9 * 5 + 0xe6546b64;
      local_1c = iVar8 + uVar2 ^ local_1c;
      uVar2 = ror32(local_1c,0x13);
      local_1c = uVar2 * 5 + 0xe6546b64;
      local_20 = uVar7 ^ local_20;
      uVar2 = bswap32(local_20);
      local_20 = uVar2 * 5;
      local_1c = uVar7 * 5 + local_1c;
      local_1c = bswap32(local_1c);
      local_24 = uVar1 * 0x1b873593 + local_24;
      swap32(&local_24,&local_1c);
      swap32(&local_24,&local_20);
      local_10 = local_10 + 0x14;
      local_40 = local_40 - 1;
    } while (local_40 != 0);
    uVar1 = ror32(local_20,0xb);
    local_20 = uVar1 * -0x3361d2af;
    uVar1 = ror32(local_20,0x11);
    local_20 = uVar1 * -0x3361d2af;
    local_24 = ror32(local_24,0xb);
    local_24 = local_24 * -0x3361d2af;
    local_24 = ror32(local_24,0x11);
    local_24 = local_24 * -0x3361d2af;
    uVar1 = ror32(local_1c + local_20,0x13);
    local_1c = uVar1 * 5 + 0xe6546b64;
    local_1c = ror32(local_1c,0x11);
    local_1c = local_1c * -0x3361d2af;
    uVar1 = ror32(local_1c + local_24,0x13);
    local_1c = uVar1 * 5 + 0xe6546b64;
    local_4 = ror32(local_1c,0x11);
    local_4 = local_4 * -0x3361d2af;
  }
  return local_4;
}

Assistant:

uint32_t farmhash32_cc(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? farmhash32_cc_len_0_to_4(s, len) : farmhash32_cc_len_5_to_12(s, len)) :
        farmhash32_cc_len_13_to_24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = ror32(fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = ror32(fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = ror32(fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = ror32(fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = ror32(fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = ror32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = ror32(fetch32(s) * c1, 17) * c2;
    uint32_t a1 = fetch32(s + 4);
    uint32_t a2 = ror32(fetch32(s + 8) * c1, 17) * c2;
    uint32_t a3 = ror32(fetch32(s + 12) * c1, 17) * c2;
    uint32_t a4 = fetch32(s + 16);
    h ^= a0;
    h = ror32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = ror32(f, 19);
    f = f * c1;
    g += a2;
    g = ror32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = ror32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap32(g) * 5;
    h += a4 * 5;
    h = bswap32(h);
    f += a0;
    PERMUTE3(&f, &h, &g);
    s += 20;
  } while (--iters != 0);
  g = ror32(g, 11) * c1;
  g = ror32(g, 17) * c1;
  f = ror32(f, 11) * c1;
  f = ror32(f, 17) * c1;
  h = ror32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  h = ror32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  return h;
}